

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Treap.h
# Opt level: O3

void __thiscall Treap<unsigned_long>::insert(Treap<unsigned_long> *this,unsigned_long val)

{
  Node *pNVar1;
  result_type_conflict rVar2;
  pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> pVar3;
  
  pNVar1 = (Node *)operator_new(0x20);
  rVar2 = utility::get_random<unsigned_long>(0,0xffffffffffffffff);
  pNVar1->p = rVar2;
  pNVar1->val = val;
  pNVar1->left = (Node *)0x0;
  pNVar1->right = (Node *)0x0;
  pVar3 = split(this,this->root,val);
  pNVar1 = merge(this,pVar3.first,pNVar1);
  pNVar1 = merge(this,pNVar1,pVar3.second);
  this->root = pNVar1;
  return;
}

Assistant:

void insert(T val) {
    Node *newNode = new Node(val);
    auto t = split(root, val);
    t.first = merge(t.first, newNode);
    root = merge(t.first, t.second);
  }